

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::DecimalQuantity::setDigitPos
          (DecimalQuantity *this,int32_t position,int8_t value)

{
  int8_t *piVar1;
  byte bVar2;
  ulong uVar3;
  
  if (this->usingBytes == true) {
    ensureCapacity(this,position + 1);
    piVar1 = (this->fBCD).bcdBytes.ptr;
    uVar3 = (ulong)position;
  }
  else {
    if (position < 0x10) {
      bVar2 = (byte)(position << 2);
      (this->fBCD).bcdLong =
           (long)value << (bVar2 & 0x3f) | ~(0xfL << (bVar2 & 0x3f)) & (this->fBCD).bcdLong;
      return;
    }
    switchStorage(this);
    ensureCapacity(this,position + 1);
    piVar1 = (this->fBCD).bcdBytes.ptr;
    uVar3 = (ulong)(uint)position;
  }
  piVar1[uVar3] = value;
  return;
}

Assistant:

void DecimalQuantity::setDigitPos(int32_t position, int8_t value) {
    U_ASSERT(position >= 0);
    if (usingBytes) {
        ensureCapacity(position + 1);
        fBCD.bcdBytes.ptr[position] = value;
    } else if (position >= 16) {
        switchStorage();
        ensureCapacity(position + 1);
        fBCD.bcdBytes.ptr[position] = value;
    } else {
        int shift = position * 4;
        fBCD.bcdLong = (fBCD.bcdLong & ~(0xfL << shift)) | ((long) value << shift);
    }
}